

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteCord
          (EpsCopyOutputStream *this,Cord *cord,uint8_t *ptr)

{
  ZeroCopyOutputStream *pZVar1;
  int iVar2;
  ptrdiff_t pVar3;
  size_t sVar4;
  uint8_t *puVar5;
  
  pVar3 = GetSize(this,ptr);
  pZVar1 = this->stream_;
  sVar4 = absl::lts_20250127::Cord::InlineRep::size(&cord->contents_);
  if (pZVar1 == (ZeroCopyOutputStream *)0x0) {
    if ((long)sVar4 <= (long)(int)pVar3) goto LAB_0028595e;
  }
  else {
    if (((long)sVar4 <= (long)(int)pVar3) &&
       (sVar4 = absl::lts_20250127::Cord::InlineRep::size(&cord->contents_), (long)sVar4 < 0x200)) {
LAB_0028595e:
      puVar5 = anon_unknown_1::CopyCordToArray(cord,ptr);
      return puVar5;
    }
    puVar5 = Trim(this,ptr);
    iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[7])(this->stream_,cord);
    if ((char)iVar2 != '\0') {
      return puVar5;
    }
  }
  this->had_error_ = true;
  this->end_ = this->buffer_ + 0x10;
  return this->buffer_;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteCord(const absl::Cord& cord, uint8_t* ptr) {
  int s = GetSize(ptr);
  if (stream_ == nullptr) {
    if (static_cast<int64_t>(cord.size()) <= s) {
      // Just copy it to the current buffer.
      return CopyCordToArray(cord, ptr);
    } else {
      return Error();
    }
  } else if (static_cast<int64_t>(cord.size()) <= s &&
             static_cast<int64_t>(cord.size()) < kMaxCordBytesToCopy) {
    // Just copy it to the current buffer.
    return CopyCordToArray(cord, ptr);
  } else {
    // Back up to the position where the Cord should start.
    ptr = Trim(ptr);
    if (!stream_->WriteCord(cord)) return Error();
    return ptr;
  }
}